

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

reference<mpt::layout::graph::transform3> * __thiscall
mpt::reference<mpt::layout::graph::transform3>::operator=
          (reference<mpt::layout::graph::transform3> *this,
          reference<mpt::layout::graph::transform3> *ref)

{
  transform3 *ref_00;
  transform3 *r;
  reference<mpt::layout::graph::transform3> *ref_local;
  reference<mpt::layout::graph::transform3> *this_local;
  
  ref_00 = ref->_ref;
  ref->_ref = (transform3 *)0x0;
  set_instance(this,ref_00);
  return this;
}

Assistant:

inline reference & operator= (reference &&ref)
	{
		T *r = ref._ref;
		ref._ref = 0;
		set_instance(r);
		return *this;
	}